

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientSession.cpp
# Opt level: O2

void __thiscall ki::protocol::net::ClientSession::on_keep_alive(ClientSession *this)

{
  _func_int **pp_Var1;
  undefined8 uVar2;
  undefined1 local_30 [16];
  ServerKeepAlive keep_alive;
  
  control::ServerKeepAlive::ServerKeepAlive(&keep_alive,0);
  Session::read_data<ki::protocol::control::ServerKeepAlive>((Session *)local_30);
  keep_alive.m_timestamp = local_30._8_4_;
  uVar2 = std::chrono::_V2::steady_clock::now();
  pp_Var1 = this->_vptr_ClientSession;
  *(undefined8 *)(&this->field_0x28 + (long)pp_Var1[-3]) = uVar2;
  Session::send_packet
            ((Session *)((long)&this->_vptr_ClientSession + (long)pp_Var1[-3]),true,'\x04',
             &keep_alive.super_Serializable);
  return;
}

Assistant:

void ClientSession::on_keep_alive()
	{
		// Read the payload data into a structure
		control::ServerKeepAlive keep_alive;
		try
		{
			keep_alive = read_data<control::ServerKeepAlive>();
		}
		catch (parse_error &e)
		{
			// The KEEP_ALIVE wasn't valid...
			// Close the session
			close(SessionCloseErrorCode::INVALID_MESSAGE);
			return;
		}

		// Send the response
		m_last_received_heartbeat_time = std::chrono::steady_clock::now();
		send_packet(true, (uint8_t)control::Opcode::KEEP_ALIVE_RSP, keep_alive);
	}